

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::
LineSegmentsRenderer<ImPlot::GetterYs<unsigned_long_long>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLin>
::operator()(LineSegmentsRenderer<ImPlot::GetterYs<unsigned_long_long>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLin>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  unsigned_long_long uVar2;
  double dVar3;
  double dVar4;
  ImVec2 IVar5;
  int iVar6;
  ImU32 IVar7;
  uint uVar8;
  GetterYs<unsigned_long_long> *pGVar9;
  GetterYRef *pGVar10;
  ImDrawVert *pIVar11;
  ImDrawIdx *pIVar12;
  double dVar13;
  double dVar14;
  ImDrawIdx IVar15;
  ImPlotContext *gp;
  bool bVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  
  pGVar9 = this->Getter1;
  pGVar10 = this->Getter2;
  iVar6 = pGVar9->Count;
  uVar2 = *(unsigned_long_long *)
           ((long)pGVar9->Ys +
           (long)(((prim + pGVar9->Offset) % iVar6 + iVar6) % iVar6) * (long)pGVar9->Stride);
  iVar6 = this->Transformer->YAxis;
  dVar14 = (double)GImPlot->PixelRange[iVar6].Min.x;
  dVar3 = (GImPlot->CurrentPlot->XAxis).Range.Min;
  fVar23 = (float)(((pGVar9->XScale * (double)prim + pGVar9->X0) - dVar3) * GImPlot->Mx + dVar14);
  dVar13 = (double)GImPlot->PixelRange[iVar6].Min.y;
  dVar4 = GImPlot->CurrentPlot->YAxis[iVar6].Range.Min;
  fVar19 = (float)(((((double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) - dVar4) *
                   GImPlot->My[iVar6] + dVar13);
  fVar18 = (float)((((double)prim * pGVar10->XScale + pGVar10->X0) - dVar3) * GImPlot->Mx + dVar14);
  fVar20 = (float)((pGVar10->YRef - dVar4) * GImPlot->My[iVar6] + dVar13);
  fVar22 = fVar19;
  if (fVar20 <= fVar19) {
    fVar22 = fVar20;
  }
  bVar16 = false;
  if ((fVar22 < (cull_rect->Max).y) &&
     (fVar22 = (float)(~-(uint)(fVar20 <= fVar19) & (uint)fVar20 |
                      -(uint)(fVar20 <= fVar19) & (uint)fVar19), pfVar1 = &(cull_rect->Min).y,
     bVar16 = false, *pfVar1 <= fVar22 && fVar22 != *pfVar1)) {
    fVar22 = fVar23;
    if (fVar18 <= fVar23) {
      fVar22 = fVar18;
    }
    if (fVar22 < (cull_rect->Max).x) {
      fVar22 = (float)(~-(uint)(fVar18 <= fVar23) & (uint)fVar18 |
                      -(uint)(fVar18 <= fVar23) & (uint)fVar23);
      bVar16 = (cull_rect->Min).x <= fVar22 && fVar22 != (cull_rect->Min).x;
    }
  }
  if (bVar16 != false) {
    fVar22 = this->Weight;
    IVar7 = this->Col;
    IVar5 = *uv;
    fVar21 = fVar18 - fVar23;
    fVar24 = fVar20 - fVar19;
    fVar17 = fVar21 * fVar21 + fVar24 * fVar24;
    if (0.0 < fVar17) {
      if (fVar17 < 0.0) {
        fVar17 = sqrtf(fVar17);
      }
      else {
        fVar17 = SQRT(fVar17);
      }
      fVar21 = fVar21 * (1.0 / fVar17);
      fVar24 = fVar24 * (1.0 / fVar17);
    }
    fVar22 = fVar22 * 0.5;
    fVar21 = fVar21 * fVar22;
    fVar22 = fVar22 * fVar24;
    pIVar11 = DrawList->_VtxWritePtr;
    (pIVar11->pos).x = fVar22 + fVar23;
    (pIVar11->pos).y = fVar19 - fVar21;
    pIVar11->uv = IVar5;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11->col = IVar7;
    pIVar11[1].pos.x = fVar22 + fVar18;
    pIVar11[1].pos.y = fVar20 - fVar21;
    pIVar11[1].uv = IVar5;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[1].col = IVar7;
    pIVar11[2].pos.x = fVar18 - fVar22;
    pIVar11[2].pos.y = fVar21 + fVar20;
    pIVar11[2].uv = IVar5;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[2].col = IVar7;
    pIVar11[3].pos.x = fVar23 - fVar22;
    pIVar11[3].pos.y = fVar21 + fVar19;
    pIVar11[3].uv = IVar5;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[3].col = IVar7;
    DrawList->_VtxWritePtr = pIVar11 + 4;
    uVar8 = DrawList->_VtxCurrentIdx;
    pIVar12 = DrawList->_IdxWritePtr;
    IVar15 = (ImDrawIdx)uVar8;
    *pIVar12 = IVar15;
    pIVar12[1] = IVar15 + 1;
    pIVar12[2] = IVar15 + 2;
    pIVar12[3] = IVar15;
    pIVar12[4] = IVar15 + 2;
    pIVar12[5] = IVar15 + 3;
    DrawList->_IdxWritePtr = pIVar12 + 6;
    DrawList->_VtxCurrentIdx = uVar8 + 4;
  }
  return bVar16;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }